

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::ConcurrentDatabase::ConcurrentDatabase
          (ConcurrentDatabase *this,char *base_path_,DatabaseMode mode_,char **extra_paths,
          size_t num_extra_paths)

{
  DatabaseInterface *pDVar1;
  __node_base_ptr *pp_Var2;
  DatabaseInterface *pDVar3;
  long lVar4;
  char *pcVar5;
  size_t i;
  size_t sVar6;
  string readonly_path;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__ConcurrentDatabase_00171c68;
  pcVar5 = "";
  if (base_path_ != (char *)0x0) {
    pcVar5 = base_path_;
  }
  std::__cxx11::string::string((string *)&this->base_path,pcVar5,(allocator *)&readonly_path);
  (this->bucket_dirname)._M_dataplus._M_p = (pointer)&(this->bucket_dirname).field_2;
  (this->bucket_dirname)._M_string_length = 0;
  (this->bucket_dirname).field_2._M_local_buf[0] = '\0';
  (this->bucket_basename)._M_dataplus._M_p = (pointer)&(this->bucket_basename).field_2;
  (this->bucket_basename)._M_string_length = 0;
  (this->bucket_basename).field_2._M_local_buf[0] = '\0';
  this->mode = mode_;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->readonly_interface)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (this->writeonly_interface)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var2 = &this->primed_hashes[0]._M_h._M_single_bucket;
  lVar4 = 0x230;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != 0);
  this->has_prepared_readonly = false;
  this->need_writeonly_database = true;
  if (this->mode != OverWrite) {
    if (this->mode == ExclusiveOverWrite) {
      this->mode = OverWrite;
    }
    else {
      if ((this->base_path)._M_string_length != 0) {
        std::operator+(&readonly_path,&this->base_path,".foz");
        pDVar3 = create_stream_archive_database(readonly_path._M_dataplus._M_p,ReadOnly);
        pDVar1 = (this->readonly_interface)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->readonly_interface)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar3;
        if (pDVar1 != (DatabaseInterface *)0x0) {
          (*pDVar1->_vptr_DatabaseInterface[1])();
        }
        std::__cxx11::string::_M_dispose();
      }
      for (sVar6 = 0; num_extra_paths != sVar6; sVar6 = sVar6 + 1) {
        readonly_path._M_dataplus._M_p =
             (pointer)create_stream_archive_database(extra_paths[sVar6],ReadOnly);
        std::
        vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
        ::emplace_back<Fossilize::DatabaseInterface*>
                  ((vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
                    *)&this->extra_readonly,(DatabaseInterface **)&readonly_path);
      }
    }
  }
  return;
}

Assistant:

explicit ConcurrentDatabase(const char *base_path_, DatabaseMode mode_,
	                            const char * const *extra_paths, size_t num_extra_paths)
		: DatabaseInterface(mode_), base_path(base_path_ ? base_path_ : ""), mode(mode_)
	{
		// Normalize this mode. The concurrent database is always "exclusive write".
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;

		if (mode != DatabaseMode::OverWrite)
		{
			if (!base_path.empty())
			{
				std::string readonly_path = base_path + ".foz";
				readonly_interface.reset(create_stream_archive_database(readonly_path.c_str(), DatabaseMode::ReadOnly));
			}

			for (size_t i = 0; i < num_extra_paths; i++)
				extra_readonly.emplace_back(create_stream_archive_database(extra_paths[i], DatabaseMode::ReadOnly));
		}
	}